

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O1

void __thiscall cashew::ValueBuilder::appendToVar(ValueBuilder *this,Ref var,IString name,Ref value)

{
  char cVar1;
  Ref *this_00;
  Value *pVVar2;
  Ref RVar3;
  undefined8 *puVar4;
  void *__ptr;
  ValueBuilder *local_40;
  Ref var_local;
  Ref value_local;
  
  var_local.inst = (Value *)name.str._M_str;
  local_40 = this;
  this_00 = (Ref *)cashew::Ref::operator[]((uint)&local_40);
  cVar1 = cashew::Ref::operator==(this_00,(IString *)&VAR);
  if (cVar1 != '\0') {
    pVVar2 = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    pVVar2->type = Null;
    pVVar2 = Value::setArray(pVVar2,1);
    __ptr = (void *)0x18;
    RVar3.inst = (Value *)MixedArena::allocSpace((MixedArena *)&arena,0x18,8);
    (RVar3.inst)->type = Null;
    Value::free(RVar3.inst,__ptr);
    (RVar3.inst)->type = String;
    ((RVar3.inst)->field_1).ref.inst = var.inst;
    ((RVar3.inst)->field_1).str.str._M_str = (char *)name.str._M_len;
    RVar3.inst = Value::push_back(pVVar2,RVar3);
    cVar1 = cashew::Ref::operator!(&var_local);
    if (cVar1 == '\0') {
      Value::push_back(RVar3.inst,var_local);
    }
    puVar4 = (undefined8 *)cashew::Ref::operator[]((uint)&local_40);
    Value::push_back((Value *)*puVar4,RVar3);
    return;
  }
  __assert_fail("var[0] == VAR",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                ,0x687,"static void cashew::ValueBuilder::appendToVar(Ref, IString, Ref)");
}

Assistant:

static void appendToVar(Ref var, IString name, Ref value) {
    assert(var[0] == VAR);
    Ref array = &makeRawArray(1)->push_back(makeRawString(name));
    if (!!value) {
      array->push_back(value);
    }
    var[1]->push_back(array);
  }